

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O2

int cmime_message_append_part(CMimeMessage_T *message,CMimePart_T *part)

{
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  CMimeList_T *list;
  
  if (message == (CMimeMessage_T *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x47c,"int cmime_message_append_part(CMimeMessage_T *, CMimePart_T *)");
  }
  if (part != (CMimePart_T *)0x0) {
    list = message->parts;
    iVar2 = list->size;
    if (iVar2 == 1) {
      _rebuild_first_part(message);
      list = message->parts;
      iVar2 = list->size;
    }
    if (0 < iVar2) {
      pvVar1 = list->tail->data;
      *(undefined2 *)((long)pvVar1 + 0x28) = 0;
      part->last = 1;
      pcVar3 = strdup(*(char **)((long)pvVar1 + 0x18));
      part->parent_boundary = pcVar3;
      cmime_list_append(list,part);
    }
    return 0;
  }
  __assert_fail("part",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                ,0x47d,"int cmime_message_append_part(CMimeMessage_T *, CMimePart_T *)");
}

Assistant:

int cmime_message_append_part(CMimeMessage_T *message, CMimePart_T *part) {
    CMimeListElem_T *elem = NULL;
    CMimePart_T *prev = NULL;
    assert(message);
    assert(part);
    
    if (message->parts->size == 1) {
        _rebuild_first_part(message); 
    }

    if (message->parts->size >= 1) {
        elem = cmime_list_tail(message->parts);
        prev = cmime_list_data(elem);
        prev->last = 0;
        part->last = 1;
        part->parent_boundary = strdup(prev->parent_boundary);
        cmime_list_append(message->parts,part);
        return(0);
    }  
    return(0);
}